

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O2

double __thiscall sophia_interface::crossection(sophia_interface *this,double x,int NDIR,int NL0)

{
  long lVar1;
  runtime_error *this_00;
  double *this_01;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double sig_res [9];
  double dStack_168;
  double SIG0 [9];
  double dStack_118;
  double AMRES [9];
  double dStack_c8;
  double WIDTH [9];
  double local_68;
  double local_38;
  double s;
  
  if (NL0 - 0xfU < 0xfffffffe) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"crossection: particle ID incorrectly specified.");
    goto LAB_0010c0b3;
  }
  SIG0[5] = 0.0;
  SIG0[6] = 0.0;
  SIG0[3] = 0.0;
  SIG0[4] = 0.0;
  SIG0[1] = 0.0;
  SIG0[2] = 0.0;
  SIG0[7] = 0.0;
  dStack_168 = 0.0;
  SIG0[0] = 0.0;
  AMRES[5] = 0.0;
  AMRES[6] = 0.0;
  AMRES[3] = 0.0;
  AMRES[4] = 0.0;
  AMRES[1] = 0.0;
  AMRES[2] = 0.0;
  dStack_118 = 0.0;
  AMRES[0] = 0.0;
  AMRES[7] = 0.0;
  WIDTH[7] = 0.0;
  WIDTH[5] = 0.0;
  WIDTH[6] = 0.0;
  WIDTH[3] = 0.0;
  WIDTH[4] = 0.0;
  WIDTH[1] = 0.0;
  WIDTH[2] = 0.0;
  dStack_c8 = 0.0;
  WIDTH[0] = 0.0;
  lVar1 = 0;
  if (NL0 == 0xd) {
    this_01 = WIDTHp;
    for (; lVar1 != 0x48; lVar1 = lVar1 + 8) {
      *(double *)((long)SIG0 + lVar1 + -8) =
           *(double *)((long)RATIOJp + lVar1) * 5.5581116134360045 *
           *(double *)((long)BGAMMAp + lVar1);
      *(undefined8 *)((long)AMRES + lVar1 + -8) = *(undefined8 *)((long)AMRESp + lVar1);
      *(undefined8 *)((long)WIDTH + lVar1 + -8) = *(undefined8 *)((long)WIDTHp + lVar1);
    }
  }
  else {
    this_01 = WIDTHn;
    for (; lVar1 != 0x48; lVar1 = lVar1 + 8) {
      *(double *)((long)SIG0 + lVar1 + -8) =
           *(double *)((long)RATIOJn + lVar1) * 5.542742930384507 *
           *(double *)((long)BGAMMAn + lVar1);
      *(undefined8 *)((long)AMRES + lVar1 + -8) = *(undefined8 *)((long)AMRESn + lVar1);
      *(undefined8 *)((long)WIDTH + lVar1 + -8) = *(undefined8 *)((long)WIDTHn + lVar1);
    }
  }
  sig_res[5] = 0.0;
  sig_res[6] = 0.0;
  sig_res[3] = 0.0;
  sig_res[4] = 0.0;
  sig_res[1] = 0.0;
  sig_res[2] = 0.0;
  sig_res[0] = 0.0;
  sig_res[7] = 0.0;
  dVar3 = AM[NL0 - 1];
  dVar3 = dVar3 * dVar3 + (dVar3 + dVar3) * x;
  if (dVar3 < 1.1646) {
    return 0.0;
  }
  WIDTH[8] = 0.0;
  s = 0.0;
  dVar4 = 0.0;
  local_38 = 0.0;
  if (x <= 10.0) {
    dVar5 = x * 1.87654 + 0.8803505929000001;
    dVar4 = dStack_c8 * dStack_c8 * dVar5;
    dVar7 = (dVar5 / x) / x;
    dVar8 = dStack_168 * dVar7;
    dVar6 = dVar5 - dStack_118 * dStack_118;
    dVar2 = Ef((sophia_interface *)this_01,x,0.152,0.17);
    s = dVar2 * ((dVar8 * dVar4) / (dVar6 * dVar6 + dVar4));
    for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
      dVar2 = WIDTH[lVar1] * WIDTH[lVar1] * dVar5;
      dVar4 = SIG0[lVar1];
      dVar8 = dVar5 - AMRES[lVar1] * AMRES[lVar1];
      dVar6 = Ef((sophia_interface *)this_01,x,0.15,0.38);
      dVar6 = dVar6 * ((dVar4 * dVar7 * dVar2) / (dVar8 * dVar8 + dVar2));
      sig_res[lVar1] = dVar6;
      s = s + dVar6;
    }
    local_38 = singleback((sophia_interface *)this_01,x);
    if ((0.1 < x) && (x < 0.6)) {
      dVar4 = exp((-(x + -0.29) * (x + -0.29)) / 0.002);
      dVar2 = exp((-(x + -0.37) * (x + -0.37)) / 0.002);
      local_38 = dVar2 * -15.0 + dVar4 * 40.0 + local_38;
    }
    WIDTH[8] = twoback((sophia_interface *)this_01,x);
    dVar4 = WIDTH[8] + local_38;
  }
  dVar2 = Ef((sophia_interface *)this_01,x,0.5,0.1);
  local_68 = pow(dVar3,-0.34);
  if (NL0 == 0xd) {
    local_68 = dVar2 * 80.3 * local_68;
    if (0.85 < x) {
      dVar2 = pow(dVar3,-0.34);
      dVar5 = pow(dVar3,0.095);
      dVar2 = dVar2 * 29.3;
      goto LAB_0010be83;
    }
LAB_0010bfc9:
    dVar6 = 0.0;
    dVar2 = 0.0;
    dVar5 = 0.0;
    dVar3 = 0.0;
  }
  else {
    local_68 = dVar2 * 60.2 * local_68;
    if (x <= 0.85) goto LAB_0010bfc9;
    dVar2 = pow(dVar3,-0.34);
    dVar5 = pow(dVar3,0.095);
    dVar2 = dVar2 * 26.4;
LAB_0010be83:
    dVar6 = exp((x + -0.85) / -0.69);
    dVar7 = (1.0 - dVar6) * (dVar2 + dVar5 * 59.3);
    dVar5 = dVar7 * 0.89;
    dVar2 = pow(x + -0.85,0.75);
    dVar6 = pow(x,-0.44);
    dVar3 = pow(dVar3,0.08);
    dVar2 = exp(dVar2 / -0.64);
    dVar3 = (1.0 - dVar2) * 0.96 * (dVar6 * 74.1 + dVar3 * 62.0);
    dVar2 = dVar3 * 0.14;
    dVar6 = dVar3 * 0.013 + dVar2;
    dVar3 = local_68 - (dVar7 * -0.11 + dVar6);
    local_68 = 0.0;
    if (0.0 <= dVar3) {
      local_68 = dVar3;
    }
    dVar3 = (double)(~-(ulong)(dVar3 < 0.0) & (ulong)dVar5 |
                    (ulong)(dVar5 + dVar3) & -(ulong)(dVar3 < 0.0));
    dVar5 = dVar3 + dVar6;
  }
  switch(NDIR) {
  case 0:
    dVar5 = s + dVar4 + dVar6;
    goto LAB_0010c04e;
  case 1:
    dVar3 = s;
    break;
  case 2:
    dVar3 = dVar4 + s;
    break;
  case 3:
    dVar5 = s + dVar4 + dVar5;
LAB_0010c04e:
    dVar3 = local_68 + dVar5;
    break;
  case 4:
    dVar3 = dVar4;
    break;
  case 5:
    break;
  case 6:
    dVar3 = s + WIDTH[8];
    break;
  case 7:
    dVar3 = s + local_38;
    break;
  case 8:
    dVar3 = s + dVar4 + dVar2;
    break;
  case 9:
    dVar3 = s + dVar4 + dVar6;
    break;
  case 10:
    dVar3 = dVar6;
    break;
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    dVar3 = sig_res[(ulong)(NDIR - 0xb) - 1];
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"wrong input NDIR in crossection.f !");
LAB_0010c0b3:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return dVar3;
}

Assistant:

double sophia_interface::crossection(double x, int NDIR, int NL0) {
// calculates crossection of Nucleon-gamma-interaction
// (see thesis of J.Rachen, p.45ff and corrections
// report from 27/04/98, 5/05/98, 22/05/98 of J.Rachen)
// ** Date: 20/01/98   **
// ** correct.:27/04/98**
// ** update: 23/05/98 **
// ** author: A.Muecke **

    if (NL0 != 13 && NL0 != 14) throw std::runtime_error("crossection: particle ID incorrectly specified.");
    const double AM2 = (NL0 == 13)? 0.880351 : 0.882792;  // used to be array AM2[49]. Only these two values of it are ever used.
    double SIG0[9] = {0.};
    double AMRES[9] = {0.};
    double WIDTH[9] = {0.};

    if (NL0 == 13) {
        for (int i = 0; i < 9; ++i) {
            SIG0[i] = 4.893089117 / AM2 * RATIOJp[i] * BGAMMAp[i];
            AMRES[i] = AMRESp[i];
            WIDTH[i] = WIDTHp[i];
        }
    }

    if (NL0 == 14) {
        for (int i = 0; i < 9; ++i) {
            SIG0[i] = 4.893089117 / AM2 * RATIOJn[i] * BGAMMAn[i];
            AMRES[i] = AMRESn[i];
            WIDTH[i] = WIDTHn[i];
        }
    }

    double sig_res[9] = {0.};

    const double sth = 1.1646;
    const double pm = AM[NL0 - 1];
    const double s = pm * pm + 2. * pm * x;
    if (s < sth) {
        return 0.;
    }
    double cross_res = 0.;
    double cross_dir = 0.;
    double cross_dir1 = 0.;
    double cross_dir2 = 0.;
    if (x <= 10.) {
        // RESONANCES:
        cross_res = breitwigner(SIG0[0], WIDTH[0], AMRES[0], x) * Ef(x, 0.152, 0.17);
        sig_res[0] = cross_res;

        for (int Ni = 1; Ni < 9; ++Ni) {
            sig_res[Ni] = breitwigner(SIG0[Ni], WIDTH[Ni], AMRES[Ni], x) * Ef(x, 0.15, 0.38);
            cross_res += sig_res[Ni];
        }
        // DIRECT CHANNEL:
        if (x > 0.1 && x < 0.6) {
            cross_dir1 = singleback(x) + 40. * std::exp(-(x - 0.29) * (x - 0.29) / 0.002) - 15. * std::exp(-(x - 0.37) * (x - 0.37) / 0.002);
        } else {
            cross_dir1 = singleback(x);
        }
        cross_dir2 = twoback(x);
        cross_dir = cross_dir1 + cross_dir2;
    }

    // FRAGMENTATION 2:
    double cross_frag2 = 0.;
    if (NL0 == 13) {
          cross_frag2 = 80.3 * Ef(x, 0.5, 0.1) * std::pow(s, -0.34);
    } else if (NL0 == 14) {
          cross_frag2 = 60.2 * Ef(x, 0.5, 0.1) * std::pow(s, -0.34);
    }

    // MULTIPION PRODUCTION/FRAGMENTATION 1 CROSS SECTION
    double cross_diffr = 0.;
    double cross_diffr1 = 0.;
    double cross_diffr2 = 0.;
    double cs_multidiff = 0.;
    double cs_multi = 0.;
    if (x > 0.85) {
        double ss1 = (x - .85) / .69;
        double ss2 = 0.;
        if (NL0 == 13) {
            ss2 = 29.3 * std::pow(s, -.34) + 59.3 * std::pow(s, .095);
        } else if (NL0 == 14) {
            ss2 = 26.4 * std::pow(s, -.34) + 59.3 * std::pow(s, .095);
        }
        cs_multidiff = (1. - std::exp(-ss1)) * ss2;
        cs_multi = 0.89 * cs_multidiff;

        // DIFFRACTIVE SCATTERING:
        cross_diffr1 = .099 * cs_multidiff;
        cross_diffr2 = .011 * cs_multidiff;
        cross_diffr = 0.11 * cs_multidiff;

        ss1 = std::pow((x - .85), .75) / .64;
        ss2 = 74.1 * std::pow(x, -.44) + 62. * std::pow(s, .08);
        double cs_tmp = 0.96 * (1. - std::exp(-ss1)) * ss2;
        cross_diffr1 = 0.14 * cs_tmp;
        cross_diffr2 = 0.013 * cs_tmp;
        double cs_delta = cross_frag2 - (cross_diffr1 + cross_diffr2 - cross_diffr);
        if (cs_delta < 0.) {
            cross_frag2 = 0.;
            cs_multi += cs_delta;
        } else {
            cross_frag2 = cs_delta;
        }
        cross_diffr = cross_diffr1 + cross_diffr2;
        cs_multidiff = cs_multi + cross_diffr;
    }

    double xSection = 0.;
    switch (NDIR) {
        case 0:
            xSection = cross_res + cross_dir + cross_diffr + cross_frag2;
            break;
        case 1:
            xSection = cross_res;
            break;
        case 2:
            xSection = cross_res + cross_dir;
            break;
        case 3:
            xSection = cross_res + cross_dir + cs_multidiff + cross_frag2;
            break;
        case 4:
            xSection = cross_dir;
            break;
        case 5:
            xSection = cs_multi;
            break;
        case 6:
            xSection = cross_res + cross_dir2;
            break;
        case 7:
            xSection = cross_res + cross_dir1;
            break;
        case 8:
            xSection = cross_res + cross_dir + cross_diffr1;
            break;
        case 9:
            xSection = cross_res + cross_dir + cross_diffr;
            break;
        case 10:
            xSection = cross_diffr;
            break;
        case 11:
        case 12:
        case 13:
        case 14:
        case 15:
        case 16:
        case 17:
        case 18:
        case 19:
            xSection = sig_res[NDIR - 11];
            break;
        default:
            throw std::runtime_error("wrong input NDIR in crossection.f !");
    }
    return xSection;
}